

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

int move_gain(CHAR_DATA *ch)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  iVar3 = 0;
  if (((ch->in_room != (ROOM_INDEX_DATA *)0x0) &&
      (bVar2 = is_affected(ch,(int)gsn_atrophy), iVar3 = 0, !bVar2)) &&
     (bVar2 = is_affected(ch,(int)gsn_prevent_healing), !bVar2)) {
    bVar2 = is_npc(ch);
    if (!bVar2) {
      if (6 < ch->pcdata->condition[4]) {
        return 5;
      }
      if (4 < ch->pcdata->condition[5]) {
        return 5;
      }
    }
    bVar2 = is_npc(ch);
    sVar1 = ch->level;
    uVar6 = (uint)sVar1;
    if (!bVar2) {
      uVar6 = (uint)(int)(short)(sVar1 - (sVar1 >> 0xf)) >> 1;
      uVar4 = 0xf;
      if (0xf < (short)uVar6) {
        uVar4 = uVar6;
      }
      uVar4 = uVar4 & 0xffff;
      if (ch->position == 5) {
        iVar3 = get_curr_stat(ch,3);
        uVar4 = uVar4 + iVar3 / 2;
      }
      else if (ch->position == 4) {
        iVar3 = get_curr_stat(ch,3);
        uVar4 = uVar4 + iVar3;
      }
      bVar2 = is_hungry(ch);
      uVar6 = (int)uVar4 / 2;
      if (!bVar2) {
        uVar6 = uVar4;
      }
      bVar2 = is_thirsty(ch);
      if (bVar2) {
        uVar6 = (int)uVar6 / 2;
      }
    }
    iVar3 = ((int)ch->in_room->heal_rate / 100) * uVar6;
    if ((ch->on != (OBJ_DATA *)0x0) && (ch->on->item_type == 0xc)) {
      iVar3 = (iVar3 * 6) / 5;
    }
    bVar2 = is_affected_by(ch,0xc);
    iVar7 = iVar3 + 3;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    iVar7 = iVar7 >> 2;
    if (!bVar2) {
      iVar7 = iVar3;
    }
    bVar2 = is_affected_by(ch,0x17);
    iVar3 = iVar7 + 7;
    if (-1 < iVar7) {
      iVar3 = iVar7;
    }
    iVar5 = iVar3 >> 3;
    if (!bVar2) {
      iVar5 = iVar7;
    }
    bVar2 = is_affected_by(ch,0x15);
    if ((bVar2) || (bVar2 = is_affected_by(ch,0x1d), bVar2)) {
      iVar5 = iVar5 * 2;
    }
    bVar2 = is_affected(ch,(int)gsn_camp);
    if (bVar2) {
      iVar3 = number_percent();
      iVar5 = iVar5 << (iVar3 < ch->pcdata->learned[gsn_camp]);
    }
    iVar3 = (int)ch->max_move - (int)ch->move;
    if (SBORROW4(iVar3,iVar5 * 2) == iVar3 + iVar5 * -2 < 0) {
      iVar3 = iVar5 * 2;
    }
  }
  return iVar3;
}

Assistant:

int move_gain(CHAR_DATA *ch)
{
	int gain;

	if (ch->in_room == nullptr)
		return 0;

	if (is_affected(ch, gsn_atrophy) || is_affected(ch, gsn_prevent_healing))
		return 0;

	if (!is_npc(ch))
	{
		if (ch->pcdata->condition[COND_STARVING] > 6)
			return 5;

		if (ch->pcdata->condition[COND_DEHYDRATED] > 4)
			return 5;
	}

	if (is_npc(ch))
	{
		gain = ch->level;
	}
	else
	{
		gain = std::max(15, ch->level / 2);

		switch (ch->position)
		{
			case POS_SLEEPING:
				gain += get_curr_stat(ch, STAT_DEX);
				break;
			case POS_RESTING:
				gain += get_curr_stat(ch, STAT_DEX) / 2;
				break;
		}

		if (is_hungry(ch))
			gain /= 2;

		if (is_thirsty(ch))
			gain /= 2;
	}

	gain *= ch->in_room->heal_rate / 100;

	if (ch->on != nullptr && ch->on->item_type == ITEM_FURNITURE)
		gain = gain * 6 / 5;

	if (is_affected_by(ch, AFF_POISON))
		gain /= 4;

	if (is_affected_by(ch, AFF_PLAGUE))
		gain /= 8;

	if (is_affected_by(ch, AFF_HASTE) || is_affected_by(ch, AFF_SLOW))
		gain *= 2;

	if (is_affected(ch, gsn_camp))
	{
		if (number_percent() < ch->pcdata->learned[gsn_camp])
			gain *= 2;
	}
	gain *= 2;
	return std::min(gain, (int)(ch->max_move - ch->move));
}